

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectbundle *
Curl_conncache_find_bundle(Curl_easy *data,connectdata *conn,conncache *connc,char **hostp)

{
  size_t key_len;
  char local_b8 [8];
  char key [128];
  connectbundle *local_30;
  connectbundle *bundle;
  char **hostp_local;
  conncache *connc_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_30 = (connectbundle *)0x0;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  if (connc != (conncache *)0x0) {
    hashkey(conn,local_b8,0x80,hostp);
    key_len = strlen(local_b8);
    local_30 = (connectbundle *)Curl_hash_pick(&connc->hash,local_b8,key_len);
  }
  return local_30;
}

Assistant:

struct connectbundle *
Curl_conncache_find_bundle(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct conncache *connc,
                           const char **hostp)
{
  struct connectbundle *bundle = NULL;
  CONNCACHE_LOCK(data);
  if(connc) {
    char key[HASHKEY_SIZE];
    hashkey(conn, key, sizeof(key), hostp);
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}